

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O2

string * __thiscall
flatbuffers::FloatConstantGenerator::GenFloatConstantImpl<double>
          (string *__return_storage_ptr__,FloatConstantGenerator *this,FieldDef *field)

{
  bool bVar1;
  double v;
  double local_20;
  
  bVar1 = StringToFloatImpl<double>(&local_20,(field->value).constant._M_dataplus._M_p);
  if (bVar1) {
    if (NAN(local_20)) {
      (*this->_vptr_FloatConstantGenerator[4])(__return_storage_ptr__,this);
    }
    else if (ABS(local_20) == INFINITY) {
      (*this->_vptr_FloatConstantGenerator[3])(__return_storage_ptr__,this);
    }
    else {
      (*this->_vptr_FloatConstantGenerator[2])(__return_storage_ptr__,this,&(field->value).constant)
      ;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("done",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/code_generators.cpp"
                ,0xe0,
                "std::string flatbuffers::FloatConstantGenerator::GenFloatConstantImpl(const FieldDef &) const [T = double]"
               );
}

Assistant:

std::string FloatConstantGenerator::GenFloatConstantImpl(
    const FieldDef &field) const {
  const auto &constant = field.value.constant;
  T v;
  auto done = StringToNumber(constant.c_str(), &v);
  FLATBUFFERS_ASSERT(done);
  if (done) {
#if (!defined(_MSC_VER) || (_MSC_VER >= 1800))
    if (std::isnan(v)) return NaN(v);
    if (std::isinf(v)) return Inf(v);
#endif
    return Value(v, constant);
  }
  return "#";  // compile time error
}